

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

void Llb_MtrAddColumn(Llb_Mtr_t *p,Llb_Grp_t *pGrp)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = (long)pGrp->Id;
  if ((-1 < lVar4) && (pGrp->Id < p->nCols)) {
    p->pColGrps[lVar4] = pGrp;
    iVar3 = 0;
    while( true ) {
      if (pGrp->vIns->nSize <= iVar3) {
        iVar3 = 0;
        while( true ) {
          if (pGrp->vOuts->nSize <= iVar3) {
            return;
          }
          pvVar2 = Vec_PtrEntry(pGrp->vOuts,iVar3);
          uVar1 = Vec_IntEntry(pGrp->pMan->vObj2Var,*(int *)((long)pvVar2 + 0x24));
          if (((int)uVar1 < 0) || (p->nRows <= (int)uVar1)) break;
          p->pMatrix[lVar4][uVar1] = '\x01';
          p->pColSums[lVar4] = p->pColSums[lVar4] + 1;
          p->pRowSums[uVar1] = p->pRowSums[uVar1] + 1;
          iVar3 = iVar3 + 1;
        }
        __assert_fail("iRow >= 0 && iRow < p->nRows",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                      ,0x16b,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
      }
      pvVar2 = Vec_PtrEntry(pGrp->vIns,iVar3);
      uVar1 = Vec_IntEntry(pGrp->pMan->vObj2Var,*(int *)((long)pvVar2 + 0x24));
      if (((int)uVar1 < 0) || (p->nRows <= (int)uVar1)) break;
      p->pMatrix[lVar4][uVar1] = '\x01';
      p->pColSums[lVar4] = p->pColSums[lVar4] + 1;
      p->pRowSums[uVar1] = p->pRowSums[uVar1] + 1;
      iVar3 = iVar3 + 1;
    }
    __assert_fail("iRow >= 0 && iRow < p->nRows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                  ,0x163,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
  }
  __assert_fail("iCol >= 0 && iCol < p->nCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                ,0x15e,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
}

Assistant:

void Llb_MtrAddColumn( Llb_Mtr_t * p, Llb_Grp_t * pGrp )
{
    Aig_Obj_t * pVar;
    int i, iRow, iCol = pGrp->Id;
    assert( iCol >= 0 && iCol < p->nCols );
    p->pColGrps[iCol] = pGrp;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vIns, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vOuts, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
}